

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

LocalSet * __thiscall wasm::DataFlow::Graph::getSet(Graph *this,Node *node)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  LocalSet *pLVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->nodeParentMap)._M_h._M_bucket_count;
  uVar4 = (ulong)node % uVar1;
  p_Var5 = (this->nodeParentMap)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Node *)p_Var5->_M_nxt[1]._M_nxt != node)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (Node *)p_Var2[1]._M_nxt == node)) goto LAB_00835f26;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00835f26:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    pLVar3 = (LocalSet *)0x0;
  }
  else {
    pLVar3 = (LocalSet *)0x0;
    if ((((LocalSet *)p_Var2[2]._M_nxt)->super_SpecificExpression<(wasm::Expression::Id)9>).
        super_Expression._id == LocalSetId) {
      pLVar3 = (LocalSet *)p_Var2[2]._M_nxt;
    }
  }
  return pLVar3;
}

Assistant:

LocalSet* getSet(Node* node) {
    auto iter = nodeParentMap.find(node);
    if (iter == nodeParentMap.end()) {
      return nullptr;
    }
    return iter->second->dynCast<LocalSet>();
  }